

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O3

void TIFFFreeDirectory(TIFF *tif)

{
  uint32_t *puVar1;
  double *pdVar2;
  uint16_t *puVar3;
  uint64_t *puVar4;
  char *p;
  float *p_00;
  void *p_01;
  TIFFTagValue *p_02;
  int iVar5;
  long lVar6;
  long lVar7;
  
  _TIFFmemset(&tif->tif_dir,0,0x10);
  pdVar2 = (tif->tif_dir).td_sminsamplevalue;
  if (pdVar2 != (double *)0x0) {
    _TIFFfreeExt(tif,pdVar2);
    (tif->tif_dir).td_sminsamplevalue = (double *)0x0;
  }
  pdVar2 = (tif->tif_dir).td_smaxsamplevalue;
  if (pdVar2 != (double *)0x0) {
    _TIFFfreeExt(tif,pdVar2);
    (tif->tif_dir).td_smaxsamplevalue = (double *)0x0;
  }
  puVar3 = (tif->tif_dir).td_colormap[0];
  if (puVar3 != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,puVar3);
    (tif->tif_dir).td_colormap[0] = (uint16_t *)0x0;
  }
  puVar3 = (tif->tif_dir).td_colormap[1];
  if (puVar3 != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,puVar3);
    (tif->tif_dir).td_colormap[1] = (uint16_t *)0x0;
  }
  puVar3 = (tif->tif_dir).td_colormap[2];
  if (puVar3 != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,puVar3);
    (tif->tif_dir).td_colormap[2] = (uint16_t *)0x0;
  }
  puVar3 = (tif->tif_dir).td_sampleinfo;
  if (puVar3 != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,puVar3);
    (tif->tif_dir).td_sampleinfo = (uint16_t *)0x0;
  }
  puVar4 = (tif->tif_dir).td_subifd;
  if (puVar4 != (uint64_t *)0x0) {
    _TIFFfreeExt(tif,puVar4);
    (tif->tif_dir).td_subifd = (uint64_t *)0x0;
  }
  p = (tif->tif_dir).td_inknames;
  if (p != (char *)0x0) {
    _TIFFfreeExt(tif,p);
    (tif->tif_dir).td_inknames = (char *)0x0;
  }
  p_00 = (tif->tif_dir).td_refblackwhite;
  if (p_00 != (float *)0x0) {
    _TIFFfreeExt(tif,p_00);
    (tif->tif_dir).td_refblackwhite = (float *)0x0;
  }
  puVar3 = (tif->tif_dir).td_transferfunction[0];
  if (puVar3 != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,puVar3);
    (tif->tif_dir).td_transferfunction[0] = (uint16_t *)0x0;
  }
  puVar3 = (tif->tif_dir).td_transferfunction[1];
  if (puVar3 != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,puVar3);
    (tif->tif_dir).td_transferfunction[1] = (uint16_t *)0x0;
  }
  puVar3 = (tif->tif_dir).td_transferfunction[2];
  if (puVar3 != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,puVar3);
    (tif->tif_dir).td_transferfunction[2] = (uint16_t *)0x0;
  }
  puVar4 = (tif->tif_dir).td_stripoffset_p;
  if (puVar4 != (uint64_t *)0x0) {
    _TIFFfreeExt(tif,puVar4);
    (tif->tif_dir).td_stripoffset_p = (uint64_t *)0x0;
  }
  puVar4 = (tif->tif_dir).td_stripbytecount_p;
  if (puVar4 != (uint64_t *)0x0) {
    _TIFFfreeExt(tif,puVar4);
    (tif->tif_dir).td_stripbytecount_p = (uint64_t *)0x0;
  }
  (tif->tif_dir).td_stripoffsetbyteallocsize = 0;
  puVar1 = (tif->tif_dir).td_fieldsset + 1;
  *puVar1 = *puVar1 & 0xfffffe7f;
  iVar5 = (tif->tif_dir).td_customValueCount;
  if (0 < iVar5) {
    lVar6 = 0x10;
    lVar7 = 0;
    do {
      p_01 = *(void **)((long)&((tif->tif_dir).td_customValues)->info + lVar6);
      if (p_01 != (void *)0x0) {
        _TIFFfreeExt(tif,p_01);
        iVar5 = (tif->tif_dir).td_customValueCount;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar7 < iVar5);
  }
  (tif->tif_dir).td_customValueCount = 0;
  p_02 = (tif->tif_dir).td_customValues;
  if (p_02 != (TIFFTagValue *)0x0) {
    _TIFFfreeExt(tif,p_02);
    (tif->tif_dir).td_customValues = (TIFFTagValue *)0x0;
  }
  _TIFFmemset(&(tif->tif_dir).td_stripoffset_entry,0,0x20);
  _TIFFmemset(&(tif->tif_dir).td_stripbytecount_entry,0,0x20);
  return;
}

Assistant:

void TIFFFreeDirectory(TIFF *tif)
{
    TIFFDirectory *td = &tif->tif_dir;
    int i;

    _TIFFmemset(td->td_fieldsset, 0, sizeof(td->td_fieldsset));
    CleanupField(td_sminsamplevalue);
    CleanupField(td_smaxsamplevalue);
    CleanupField(td_colormap[0]);
    CleanupField(td_colormap[1]);
    CleanupField(td_colormap[2]);
    CleanupField(td_sampleinfo);
    CleanupField(td_subifd);
    CleanupField(td_inknames);
    CleanupField(td_refblackwhite);
    CleanupField(td_transferfunction[0]);
    CleanupField(td_transferfunction[1]);
    CleanupField(td_transferfunction[2]);
    CleanupField(td_stripoffset_p);
    CleanupField(td_stripbytecount_p);
    td->td_stripoffsetbyteallocsize = 0;
    TIFFClrFieldBit(tif, FIELD_YCBCRSUBSAMPLING);
    TIFFClrFieldBit(tif, FIELD_YCBCRPOSITIONING);

    /* Cleanup custom tag values */
    for (i = 0; i < td->td_customValueCount; i++)
    {
        if (td->td_customValues[i].value)
            _TIFFfreeExt(tif, td->td_customValues[i].value);
    }

    td->td_customValueCount = 0;
    CleanupField(td_customValues);

    _TIFFmemset(&(td->td_stripoffset_entry), 0, sizeof(TIFFDirEntry));
    _TIFFmemset(&(td->td_stripbytecount_entry), 0, sizeof(TIFFDirEntry));
}